

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jerror.c
# Opt level: O0

void output_message(j_common_ptr cinfo)

{
  char local_d8 [8];
  char buffer [200];
  j_common_ptr cinfo_local;
  
  buffer._192_8_ = cinfo;
  (*cinfo->err->format_message)(cinfo,local_d8);
  return;
}

Assistant:

METHODDEF(void)
output_message (j_common_ptr cinfo)
{
  char buffer[JMSG_LENGTH_MAX];

  /* Create the message */
  (*cinfo->err->format_message) (cinfo, buffer);

#ifdef USE_WINDOWS_MESSAGEBOX
  /* Display it in a message dialog box */
  MessageBox(GetActiveWindow(), buffer, "JPEG Library Error",
	     MB_OK | MB_ICONERROR);
#else
  /* Send it to stderr, adding a newline */
//  fprintf(stderr, "%s\n", buffer);
//  printf( "%s\n", buffer);
#endif
}